

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGhsMultiGenerator.cxx
# Opt level: O0

void __thiscall
cmGlobalGhsMultiGenerator::WriteFileHeader(cmGlobalGhsMultiGenerator *this,ostream *fout)

{
  uint uVar1;
  ostream *poVar2;
  void *pvVar3;
  string local_38 [32];
  ostream *local_18;
  ostream *fout_local;
  cmGlobalGhsMultiGenerator *this_local;
  
  local_18 = fout;
  fout_local = (ostream *)this;
  poVar2 = std::operator<<(fout,"#!gbuild");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(local_18,"#");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"# CMAKE generated file: DO NOT EDIT!");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"# Generated by \"");
  GetActualName_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,"\"");
  poVar2 = std::operator<<(poVar2," Generator, CMake Version ");
  uVar1 = cmVersion::GetMajorVersion();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = std::operator<<(poVar2,".");
  uVar1 = cmVersion::GetMinorVersion();
  pvVar3 = (void *)std::ostream::operator<<(poVar2,uVar1);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2,"#");
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar3,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void cmGlobalGhsMultiGenerator::WriteFileHeader(std::ostream& fout)
{
  fout << "#!gbuild" << std::endl;
  fout << "#" << std::endl
       << "# CMAKE generated file: DO NOT EDIT!" << std::endl
       << "# Generated by \"" << GetActualName() << "\""
       << " Generator, CMake Version " << cmVersion::GetMajorVersion() << "."
       << cmVersion::GetMinorVersion() << std::endl
       << "#" << std::endl
       << std::endl;
}